

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNot(UnicodeSetStringSpan *this,UChar *s,int32_t length)

{
  short *psVar1;
  short *psVar2;
  UChar UVar3;
  ushort uVar4;
  uint uVar5;
  bool bVar6;
  UBool UVar7;
  int32_t iVar8;
  int iVar9;
  void *pvVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  int32_t length_00;
  int iVar14;
  int iVar15;
  ulong uVar16;
  UChar *pUVar17;
  int32_t local_54;
  
  uVar5 = this->strings->count;
  iVar15 = 0;
  length_00 = length;
  do {
    iVar8 = UnicodeSet::span(this->pSpanNotSet,s + iVar15,length_00,USET_SPAN_NOT_CONTAINED);
    length_00 = length_00 - iVar8;
    if (length_00 == 0) {
      return length;
    }
    iVar15 = iVar15 + iVar8;
    pUVar17 = s + iVar15;
    UVar3 = *pUVar17;
    if (((length_00 < 2) || (((ushort)UVar3 & 0xfc00) != 0xd800)) ||
       (((ushort)pUVar17[1] & 0xfc00) != 0xdc00)) {
      UVar7 = UnicodeSet::contains(&this->spanSet,(uint)(ushort)UVar3);
      uVar13 = -(uint)(UVar7 == '\0') | 1;
    }
    else {
      UVar7 = UnicodeSet::contains
                        (&this->spanSet,
                         (uint)(ushort)UVar3 * 0x400 + (uint)(ushort)pUVar17[1] + -0x35fdc00);
      uVar13 = (uint)(UVar7 != '\0') * 4 - 2;
    }
    if ((int)uVar13 < 1) {
      if (0 < (int)uVar5) {
        uVar16 = 0;
        do {
          if (this->spanLengths[uVar16] != 0xff) {
            pvVar10 = UVector::elementAt(this->strings,(int32_t)uVar16);
            uVar4 = *(ushort *)((long)pvVar10 + 8);
            if ((uVar4 & 0x11) == 0) {
              if ((uVar4 & 2) == 0) {
                lVar11 = *(long *)((long)pvVar10 + 0x18);
              }
              else {
                lVar11 = (long)pvVar10 + 10;
              }
            }
            else {
              lVar11 = 0;
            }
            if ((short)uVar4 < 0) {
              iVar9 = *(int *)((long)pvVar10 + 0xc);
            }
            else {
              iVar9 = (int)(short)uVar4 >> 5;
            }
            if (length_00 < iVar9) {
LAB_002c187d:
              bVar6 = true;
            }
            else {
              lVar12 = 0;
              iVar14 = iVar9;
              do {
                psVar1 = (short *)((long)pUVar17 + lVar12);
                psVar2 = (short *)(lVar11 + lVar12);
                if (*psVar1 != *psVar2) break;
                lVar12 = lVar12 + 2;
                bVar6 = 1 < iVar14;
                iVar14 = iVar14 + -1;
              } while (bVar6);
              if (((*psVar1 != *psVar2) ||
                  (((0 < iVar15 && ((pUVar17[-1] & 0xfc00U) == 0xd800)) &&
                   ((*pUVar17 & 0xfc00U) == 0xdc00)))) ||
                 (((iVar9 < length - iVar15 && ((pUVar17[(long)iVar9 + -1] & 0xfc00U) == 0xd800)) &&
                  ((pUVar17[iVar9] & 0xfc00U) == 0xdc00)))) goto LAB_002c187d;
              bVar6 = false;
              local_54 = iVar15;
            }
            if (!bVar6) {
              bVar6 = false;
              goto LAB_002c18ac;
            }
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar5);
      }
      iVar15 = iVar15 - uVar13;
      length_00 = length_00 + uVar13;
      bVar6 = true;
    }
    else {
      bVar6 = false;
      local_54 = iVar15;
    }
LAB_002c18ac:
    if (!bVar6) {
      return local_54;
    }
    if (length_00 == 0) {
      return length;
    }
  } while( true );
}

Assistant:

int32_t UnicodeSetStringSpan::spanNot(const UChar *s, int32_t length) const {
    int32_t pos=0, rest=length;
    int32_t i, stringsLength=strings.size();
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        i=pSpanNotSet->span(s+pos, rest, USET_SPAN_NOT_CONTAINED);
        if(i==rest) {
            return length;  // Reached the end of the string.
        }
        pos+=i;
        rest-=i;

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOne(spanSet, s+pos, rest);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        for(i=0; i<stringsLength; ++i) {
            if(spanLengths[i]==ALL_CP_CONTAINED) {
                continue;  // Irrelevant string.
            }
            const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
            const UChar *s16=string.getBuffer();
            int32_t length16=string.length();
            if(length16<=rest && matches16CPB(s, pos, length, s16, length16)) {
                return pos;  // There is a set element at pos.
            }
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos-=cpLength;
        rest+=cpLength;
    } while(rest!=0);
    return length;  // Reached the end of the string.
}